

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino_strmap.c
# Opt level: O2

char * dino_strmap_get_value(str_map_t *map,char *key)

{
  unsigned_long uVar1;
  pair_t *ppVar2;
  char *pcVar3;
  
  pcVar3 = "";
  if (key != (char *)0x0 && map != (str_map_t *)0x0) {
    uVar1 = hash(key);
    ppVar2 = get_pair(map->buckets + uVar1 % (ulong)map->count,key);
    if (ppVar2 != (pair_t *)0x0) {
      pcVar3 = ppVar2->value;
    }
  }
  return pcVar3;
}

Assistant:

const char *dino_strmap_get_value(const str_map_t *map, const char *key) {
    if (NULL == map || NULL == key) {
        return "";
    }

    unsigned int index = (unsigned int) (hash(key) % map->count);
    bucket_t *bucket = &(map->buckets[index]);
    pair_t *pair = get_pair(bucket, key);
    if (NULL == pair) {
        return "";
    }

    return pair->value;
}